

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O3

PBuffer __thiscall ConvertorPCM2WAV::convert(ConvertorPCM2WAV *this)

{
  enable_shared_from_this<Buffer> *peVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ConvertorPCM2WAV *in_RSI;
  PBuffer PVar8;
  PBuffer data;
  PBuffer header;
  string local_98;
  element_type *local_70;
  element_type *local_68;
  ConvertorPCM2WAV local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_60.super_Convertor._vptr_Convertor._0_4_ = 1;
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (allocator<MutableBuffer> *)&local_70,(EndianessMode *)&local_60);
  sVar6 = local_98._M_string_length;
  _Var5._M_p = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  p_Var3 = (in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var5._M_p;
  (in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
    }
  }
  create_header(&local_60);
  local_60.rate =
       (size_t)(in_RSI->super_Convertor).buffer.
               super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28 = (in_RSI->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  (*(in_RSI->super_Convertor)._vptr_Convertor[3])(&local_70);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  MutableBuffer::push((in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"RIFF");
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_60.super_Convertor._vptr_Convertor._4_4_,
                    local_60.super_Convertor._vptr_Convertor._0_4_);
  MutableBuffer::push<unsigned_int>
            ((in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int)local_70->size + *(int *)&p_Var3[2]._vptr__Sp_counted_base + 0x14,1);
  MutableBuffer::push((in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"WAVE");
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"fmt ","");
  local_60.chenals =
       (size_t)local_60.super_Convertor.buffer.
               super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_60.super_Convertor.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_60.super_Convertor.buffer.
                 super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_60.super_Convertor.buffer.
                      super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_60.super_Convertor.buffer.
                 super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_60.super_Convertor.buffer.
                      super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_60.result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  write_chunk(in_RSI,&local_98,
              (PBuffer *)
              &local_60.result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
  if ((element_type *)local_60.chenals != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.chenals);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"data","");
  local_60.super_Convertor.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
  local_60.result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  if (local_68 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(local_68->super_Buffer).super_enable_shared_from_this<Buffer>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(local_68->super_Buffer).super_enable_shared_from_this<Buffer>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  write_chunk(in_RSI,&local_98,
              (PBuffer *)
              &local_60.super_Convertor.buffer.
               super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var7._M_pi = extraout_RDX;
  if (local_60.result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    _Var7._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    _Var7._M_pi = extraout_RDX_01;
  }
  (this->super_Convertor)._vptr_Convertor =
       (_func_int **)
       (in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (element_type *)
           (in_RSI->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  if (peVar4 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(peVar4->super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar4->super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(peVar4->super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar4->super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  if (local_68 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
    _Var7._M_pi = extraout_RDX_02;
  }
  if (local_60.super_Convertor.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.super_Convertor.buffer.
               super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var7._M_pi = extraout_RDX_03;
  }
  PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorPCM2WAV::convert() {
  result = std::make_shared<MutableBuffer>(Buffer::EndianessLittle);

  PBuffer header = create_header();
  PBuffer data = create_data(buffer);

  result->push("RIFF");
  result->push<uint32_t>(static_cast<uint32_t>(header->get_size() +
                                               data->get_size() + 20));
  result->push("WAVE");
  write_chunk("fmt ", header);
  write_chunk("data", data);

  return result;
}